

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_read_binary_le(mbedtls_mpi *X,uchar *buf,size_t buflen)

{
  int iVar1;
  size_t nblimbs;
  size_t limbs;
  size_t i;
  int ret;
  size_t buflen_local;
  uchar *buf_local;
  mbedtls_mpi *X_local;
  
  nblimbs = (buflen >> 3) + (long)(int)(uint)((buflen & 7) != 0);
  if (X->n != nblimbs) {
    mbedtls_mpi_free(X);
    mbedtls_mpi_init(X);
    iVar1 = mbedtls_mpi_grow(X,nblimbs);
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  iVar1 = mbedtls_mpi_lset(X,0);
  if (iVar1 == 0) {
    for (limbs = 0; limbs < buflen; limbs = limbs + 1) {
      X->p[limbs >> 3] = (ulong)buf[limbs] << (sbyte)((limbs & 7) << 3) | X->p[limbs >> 3];
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_mpi_read_binary_le( mbedtls_mpi *X,
                                const unsigned char *buf, size_t buflen )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i;
    size_t const limbs = CHARS_TO_LIMBS( buflen );

    /* Ensure that target MPI has exactly the necessary number of limbs */
    if( X->n != limbs )
    {
        mbedtls_mpi_free( X );
        mbedtls_mpi_init( X );
        MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, limbs ) );
    }

    MBEDTLS_MPI_CHK( mbedtls_mpi_lset( X, 0 ) );

    for( i = 0; i < buflen; i++ )
        X->p[i / ciL] |= ((mbedtls_mpi_uint) buf[i]) << ((i % ciL) << 3);

cleanup:

    /*
     * This function is also used to import keys. However, wiping the buffers
     * upon failure is not necessary because failure only can happen before any
     * input is copied.
     */
    return( ret );
}